

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListCol3f
          (X3DImporter *this,int pAttrIdx,list<aiColor3D,_std::allocator<aiColor3D>_> *pValue)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  reference pfVar5;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_a8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_a0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_98;
  undefined1 local_8c [8];
  aiColor3D tcol;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  iterator it;
  string local_68;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> tlist;
  list<aiColor3D,_std::allocator<aiColor3D>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  tlist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pValue;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)local_38);
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_38);
  if (sVar3 % 3 != 0) {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar4,(ulong)(uint)pAttrIdx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,(char *)CONCAT44(extraout_var,iVar2),
               (allocator *)((long)&it._M_current + 7));
    Throw_ConvertFail_Str2ArrF(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  }
  local_78._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)local_38);
  while( true ) {
    tcol._4_8_ = std::vector<float,_std::allocator<float>_>::end
                           ((vector<float,_std::allocator<float>_> *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       &tcol.g);
    if (!bVar1) break;
    aiColor3D::aiColor3D((aiColor3D *)local_8c);
    local_98 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator++(&local_78,0);
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_98);
    local_8c._0_4_ = *pfVar5;
    local_a0 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator++(&local_78,0);
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_a0);
    local_8c._4_4_ = *pfVar5;
    local_a8 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator++(&local_78,0);
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_a8);
    tcol.r = *pfVar5;
    std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::push_back
              ((list<aiColor3D,_std::allocator<aiColor3D>_> *)
               tlist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(aiColor3D *)local_8c);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListCol3f(const int pAttrIdx, std::list<aiColor3D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
	if(tlist.size() % 3) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiColor3D tcol;

		tcol.r = *it++;
		tcol.g = *it++;
		tcol.b = *it++;
		pValue.push_back(tcol);
	}
}